

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

string * __thiscall
AssemblyCode::CallCommand::ToString_abi_cxx11_(string *__return_storage_ptr__,CallCommand *this)

{
  string *psVar1;
  string *psVar2;
  CTemp argument;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  IRT::CLabel::ToString_abi_cxx11_(&local_70,&this->address);
  std::operator+(&local_b0,"call (",&local_70);
  std::operator+(&local_90,&local_b0,") ");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  psVar1 = (string *)
           (this->arguments).super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (psVar2 = (string *)
                (this->arguments).super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 0x20)
  {
    std::__cxx11::string::string((string *)&local_b0,psVar2);
    IRT::CTemp::ToString_abi_cxx11_(&local_50,(CTemp *)&local_b0);
    std::operator+(&local_70,&local_50," ");
    std::__cxx11::string::append((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::operator+(__return_storage_ptr__,&local_90,"\n");
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblyCode::CallCommand::ToString( ) const {
    std::string command = "call (" + address.ToString( ) + ") ";
    for ( auto argument : arguments ) {
        command += argument.ToString( ) + " ";
    }
    return command + "\n";
}